

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall spirv_cross::Compiler::type_contains_recursion(Compiler *this,SPIRType *type)

{
  bool bVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  checked_ids;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_40;
  
  local_40._M_buckets = &local_40._M_single_bucket;
  local_40._M_bucket_count = 1;
  local_40._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_40._M_element_count = 0;
  local_40._M_rehash_policy._M_max_load_factor = 1.0;
  local_40._M_rehash_policy._M_next_resize = 0;
  local_40._M_single_bucket = (__node_base_ptr)0x0;
  bVar1 = check_internal_recursion
                    (this,type,
                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&local_40);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_40);
  return bVar1;
}

Assistant:

void Compiler::flush_control_dependent_expressions(uint32_t block_id)
{
	auto &block = get<SPIRBlock>(block_id);
	for (auto &expr : block.invalidate_expressions)
		invalid_expressions.insert(expr);
	block.invalidate_expressions.clear();
}